

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testCharRanges(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlParserCtxtPtr ctxt_00;
  long lVar4;
  long *plVar5;
  int local_34;
  int test_ret;
  xmlParserInputPtr input;
  xmlParserInputBufferPtr buf;
  xmlParserCtxtPtr ctxt;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char data [5];
  
  memset((void *)((long)&ctxt + 7),0,5);
  ctxt_00 = (xmlParserCtxtPtr)xmlNewParserCtxt();
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    fprintf(_stderr,"Failed to allocate parser context\n");
    cStack_c = '\x01';
    cStack_b = '\0';
    cStack_a = '\0';
    data[0] = '\0';
  }
  else {
    lVar4 = xmlParserInputBufferCreateStatic((long)&ctxt + 7,5,0);
    if (lVar4 == 0) {
      fprintf(_stderr,"Failed to allocate input buffer\n");
      local_34 = 1;
    }
    else {
      plVar5 = (long *)xmlNewInputStream(ctxt_00);
      if (plVar5 == (long *)0x0) {
        xmlFreeParserInputBuffer(lVar4);
        local_34 = 1;
      }
      else {
        plVar5[1] = 0;
        *plVar5 = lVar4;
        lVar4 = xmlBufContent(*(undefined8 *)(*plVar5 + 0x20));
        plVar5[3] = lVar4;
        plVar5[4] = lVar4;
        plVar5[5] = plVar5[3] + 4;
        xmlCtxtPushInput(ctxt_00,plVar5);
        printf("testing char range: 1");
        fflush(_stdout);
        iVar1 = testCharRangeByte1(ctxt_00);
        printf(" 2");
        fflush(_stdout);
        iVar2 = testCharRangeByte2(ctxt_00);
        printf(" 3");
        fflush(_stdout);
        iVar3 = testCharRangeByte3(ctxt_00);
        printf(" 4");
        fflush(_stdout);
        local_34 = testCharRangeByte4(ctxt_00);
        local_34 = local_34 + iVar3 + iVar2 + iVar1;
        printf(" done\n");
        fflush(_stdout);
      }
    }
    xmlFreeParserCtxt(ctxt_00);
    cStack_c = (undefined1)local_34;
    cStack_b = local_34._1_1_;
    cStack_a = local_34._2_1_;
    data[0] = local_34._3_1_;
  }
  iVar1._0_1_ = cStack_c;
  iVar1._1_1_ = cStack_b;
  iVar1._2_1_ = cStack_a;
  iVar1._3_1_ = data[0];
  return iVar1;
}

Assistant:

static int testCharRanges(void) {
    char data[5];
    xmlParserCtxtPtr ctxt;
    xmlParserInputBufferPtr buf;
    xmlParserInputPtr input;
    int test_ret = 0;

    memset(data, 0, 5);

    /*
     * Set up a parsing context using the above data buffer as
     * the current input source.
     */
    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        fprintf(stderr, "Failed to allocate parser context\n");
	return(1);
    }
    buf = xmlParserInputBufferCreateStatic(data, sizeof(data),
                                           XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
        fprintf(stderr, "Failed to allocate input buffer\n");
	test_ret = 1;
	goto error;
    }
    input = xmlNewInputStream(ctxt);
    if (input == NULL) {
        xmlFreeParserInputBuffer(buf);
	test_ret = 1;
	goto error;
    }
    input->filename = NULL;
    input->buf = buf;
    input->cur =
    input->base = xmlBufContent(input->buf->buffer);
    input->end = input->base + 4;
    xmlCtxtPushInput(ctxt, input);

    printf("testing char range: 1");
    fflush(stdout);
    test_ret += testCharRangeByte1(ctxt);
    printf(" 2");
    fflush(stdout);
    test_ret += testCharRangeByte2(ctxt);
    printf(" 3");
    fflush(stdout);
    test_ret += testCharRangeByte3(ctxt);
    printf(" 4");
    fflush(stdout);
    test_ret += testCharRangeByte4(ctxt);
    printf(" done\n");
    fflush(stdout);

error:
    xmlFreeParserCtxt(ctxt);
    return(test_ret);
}